

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasquadtree.cpp
# Opt level: O2

void __thiscall
LASquadtree::get_cell_bounding_box(LASquadtree *this,F64 x,F64 y,U32 level,F32 *min,F32 *max)

{
  F32 FVar1;
  bool bVar2;
  F32 FVar3;
  float fVar4;
  float fVar5;
  F32 FVar6;
  F32 FVar7;
  float fVar8;
  float fVar9;
  float cell_mid_y;
  float cell_mid_x;
  
  FVar6 = this->min_x;
  FVar3 = this->max_x;
  FVar1 = this->max_y;
  FVar7 = this->min_y;
  while (fVar5 = (float)FVar1, bVar2 = level != 0, level = level - 1, bVar2) {
    fVar8 = ((float)FVar6 + (float)FVar3) * 0.5;
    fVar9 = ((float)FVar7 + fVar5) * 0.5;
    fVar4 = fVar8;
    if ((double)fVar8 <= (double)x) {
      fVar4 = (float)FVar3;
      FVar6 = (F32)fVar8;
    }
    FVar3 = (F32)fVar4;
    FVar1 = (F32)fVar9;
    if ((double)fVar9 <= (double)y) {
      FVar1 = (F32)fVar5;
      FVar7 = (F32)fVar9;
    }
  }
  if (min != (F32 *)0x0) {
    *min = FVar6;
    min[1] = FVar7;
  }
  if (max != (F32 *)0x0) {
    *max = FVar3;
    max[1] = (F32)fVar5;
  }
  return;
}

Assistant:

void LASquadtree::get_cell_bounding_box(const F64 x, const F64 y, U32 level, F32* min, F32* max) const
{
  volatile float cell_mid_x;
  volatile float cell_mid_y;
  float cell_min_x, cell_max_x;
  float cell_min_y, cell_max_y;
  
  cell_min_x = min_x;
  cell_max_x = max_x;
  cell_min_y = min_y;
  cell_max_y = max_y;

  while (level)
  {
    cell_mid_x = (cell_min_x + cell_max_x)/2;
    cell_mid_y = (cell_min_y + cell_max_y)/2;
    if (x < cell_mid_x)
    {
      cell_max_x = cell_mid_x;
    }
    else
    {
      cell_min_x = cell_mid_x;
    }
    if (y < cell_mid_y)
    {
      cell_max_y = cell_mid_y;
    }
    else
    {
      cell_min_y = cell_mid_y;
    }
    level--;
  }
  if (min)
  {
    min[0] = cell_min_x;
    min[1] = cell_min_y;
  }
  if (max)
  {
    max[0] = cell_max_x;
    max[1] = cell_max_y;
  }
}